

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

XMLCh * __thiscall PSVIWriterHandlers::translateBlockOrFinal(PSVIWriterHandlers *this,short val)

{
  wchar16 *pwVar1;
  
  xercesc_4_0::XMLString::copyString
            (this->fTempResult,(wchar16 *)&xercesc_4_0::XMLUni::fgZeroLenString);
  if ((val & 1U) != 0) {
    xercesc_4_0::XMLString::catString
              (this->fTempResult,(wchar16 *)&xercesc_4_0::PSVIUni::fgExtension);
  }
  if ((val & 2U) != 0) {
    pwVar1 = this->fTempResult;
    if ((pwVar1 != (wchar16 *)0x0) && (*pwVar1 != L'\0')) {
      xercesc_4_0::XMLString::catString(pwVar1,L" ");
    }
    xercesc_4_0::XMLString::catString
              (this->fTempResult,(wchar16 *)&xercesc_4_0::PSVIUni::fgRestriction);
  }
  if ((val & 0x10U) != 0) {
    pwVar1 = this->fTempResult;
    if ((pwVar1 != (wchar16 *)0x0) && (*pwVar1 != L'\0')) {
      xercesc_4_0::XMLString::catString(pwVar1,L" ");
    }
    xercesc_4_0::XMLString::catString(this->fTempResult,(wchar16 *)&xercesc_4_0::PSVIUni::fgList);
  }
  if ((val & 8U) != 0) {
    pwVar1 = this->fTempResult;
    if ((pwVar1 != (wchar16 *)0x0) && (*pwVar1 != L'\0')) {
      xercesc_4_0::XMLString::catString(pwVar1,L" ");
    }
    xercesc_4_0::XMLString::catString(this->fTempResult,(wchar16 *)&xercesc_4_0::PSVIUni::fgUnion);
  }
  if ((val & 4U) != 0) {
    pwVar1 = this->fTempResult;
    if ((pwVar1 != (wchar16 *)0x0) && (*pwVar1 != L'\0')) {
      xercesc_4_0::XMLString::catString(pwVar1,L" ");
    }
    xercesc_4_0::XMLString::catString
              (this->fTempResult,(wchar16 *)&xercesc_4_0::PSVIUni::fgSubstitution);
  }
  return this->fTempResult;
}

Assistant:

const XMLCh* PSVIWriterHandlers::translateBlockOrFinal(short val) {
	XMLString::copyString(fTempResult, XMLUni::fgZeroLenString);
	if ((val & XSConstants::DERIVATION_EXTENSION) != 0) {
		XMLString::catString(fTempResult, PSVIUni::fgExtension);
	}
	if ((val & XSConstants::DERIVATION_RESTRICTION) != 0) {
		if (fTempResult && *fTempResult)
			XMLString::catString(fTempResult, fgSpace);
		XMLString::catString(fTempResult, PSVIUni::fgRestriction);
	}
	if ((val & XSConstants::DERIVATION_LIST) != 0) {
		if (fTempResult && *fTempResult)
			XMLString::catString(fTempResult, fgSpace);
		XMLString::catString(fTempResult, PSVIUni::fgList);
	}
	if ((val & XSConstants::DERIVATION_UNION) != 0) {
		if (fTempResult && *fTempResult)
			XMLString::catString(fTempResult, fgSpace);
		XMLString::catString(fTempResult, PSVIUni::fgUnion);
	}
	if ((val & XSConstants::DERIVATION_SUBSTITUTION) != 0) {
		if (fTempResult && *fTempResult)
			XMLString::catString(fTempResult, fgSpace);
		XMLString::catString(fTempResult, PSVIUni::fgSubstitution);
	}
	return fTempResult;
}